

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

Option * __thiscall CLI::App::operator[](App *this,string *option_name)

{
  Option *pOVar1;
  string local_38;
  string *local_18;
  string *option_name_local;
  App *this_local;
  
  local_18 = option_name;
  option_name_local = (string *)this;
  ::std::__cxx11::string::string((string *)&local_38,(string *)option_name);
  pOVar1 = get_option(this,&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  return pOVar1;
}

Assistant:

const Option *operator[](const std::string &option_name) const { return get_option(option_name); }